

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeMe.hpp
# Opt level: O0

void SerializeMe::DeserializeFromBuffer<Point3D>(SpanBytesConst *buffer,Point3D *dest)

{
  Serializer<Point3D> local_21;
  anon_class_8_1_4eff857e local_20;
  anon_class_8_1_4eff857e func;
  Point3D *dest_local;
  SpanBytesConst *buffer_local;
  
  local_20.buffer = buffer;
  func.buffer = (SpanBytesConst *)dest;
  Serializer<Point3D>::operator()(&local_21,dest,&local_20);
  return;
}

Assistant:

inline void DeserializeFromBuffer(SpanBytesConst& buffer, T& dest)
{
  if constexpr (std::is_arithmetic_v<T> || std::is_same_v<T, std::byte>)
  {
    auto const S = sizeof(T);
    if (S > buffer.size())
    {
      throw std::runtime_error("DeserializeFromBuffer: buffer overflow");
    }
    dest = *(reinterpret_cast<T const*>(buffer.data()));

#if SERIALIZE_LITTLEENDIAN == 0
    dest = EndianSwap<T>(dest);
#endif
    buffer = SpanBytesConst(buffer.data() + S, buffer.size() - S);   // NOLINT
  }
  else
  {
    static_assert(is_serializer_defined<T>(), "Missing specialization of class "
                                              "Serialize<>. Check errors below");
    if constexpr (is_serializer_defined<T>())
    {
      auto func = [&buffer](auto& field) { DeserializeFromBuffer(buffer, field); };
      Serializer<T>().operator()(const_cast<T&>(dest), func);
    }
  }
}